

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_4::EmptyIterator::EmptyIterator(EmptyIterator *this,Status *s)

{
  char *pcVar1;
  
  pcVar1 = (char *)0x0;
  (this->super_Iterator).cleanup_head_.function = (CleanupFunction)0x0;
  (this->super_Iterator).cleanup_head_.next = (CleanupNode *)0x0;
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__EmptyIterator_00139438;
  if (s->state_ != (char *)0x0) {
    pcVar1 = Status::CopyState(s->state_);
  }
  (this->status_).state_ = pcVar1;
  return;
}

Assistant:

EmptyIterator(const Status& s) : status_(s) {}